

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

pcut_item_t * pcut_fix_list_get_real_head(pcut_item_t *last)

{
  pcut_item_t *local_20;
  pcut_item_t *it;
  pcut_item_t *next;
  pcut_item_t *last_local;
  
  last->next = (pcut_item_t *)0x0;
  inline_nested_lists(last);
  it = last;
  for (local_20 = last->previous; local_20 != (pcut_item_t *)0x0; local_20 = local_20->previous) {
    local_20->next = it;
    inline_nested_lists(local_20);
    it = local_20;
  }
  detect_skipped_tests(it);
  set_ids(it);
  return it;
}

Assistant:

pcut_item_t *pcut_fix_list_get_real_head(pcut_item_t *last) {
	pcut_item_t *next, *it;

	last->next = NULL;

	inline_nested_lists(last);

	next = last;
	it = last->previous;
	while (it != NULL) {
		it->next = next;
		inline_nested_lists(it);
		next = it;
		it = it->previous;
	}

	detect_skipped_tests(next);

	set_ids(next);

	return next;
}